

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool bitset_container_negation_range_inplace
                (bitset_container_t *src,int range_start,int range_end,container_t **dst)

{
  uint64_t *puVar1;
  int iVar2;
  array_container_t *paVar3;
  uint uVar4;
  ulong uVar5;
  
  if (range_start != range_end) {
    puVar1 = src->words;
    uVar5 = (ulong)((uint)range_start >> 6);
    uVar4 = range_end - 1U >> 6;
    puVar1[uVar5] = ~(-1L << ((byte)range_start & 0x3f) ^ puVar1[uVar5]);
    if ((uint)range_start >> 6 < uVar4) {
      do {
        puVar1[uVar5] = ~puVar1[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    puVar1[uVar4] = puVar1[uVar4] ^ 0xffffffffffffffffU >> (-(char)range_end & 0x3fU);
  }
  iVar2 = bitset_container_compute_cardinality(src);
  src->cardinality = iVar2;
  if (iVar2 < 0x1001) {
    paVar3 = array_container_from_bitset(src);
    *dst = paVar3;
    if (src->words != (uint64_t *)0x0) {
      (*global_memory_hook.aligned_free)(src->words);
      src->words = (uint64_t *)0x0;
    }
    (*global_memory_hook.free)(src);
  }
  else {
    *dst = src;
  }
  return 0x1000 < iVar2;
}

Assistant:

bool bitset_container_negation_range_inplace(bitset_container_t *src,
                                             const int range_start,
                                             const int range_end,
                                             container_t **dst) {
    bitset_flip_range(src->words, (uint32_t)range_start, (uint32_t)range_end);
    src->cardinality = bitset_container_compute_cardinality(src);
    if (src->cardinality > DEFAULT_MAX_SIZE) {
        *dst = src;
        return true;
    }
    *dst = array_container_from_bitset(src);
    bitset_container_free(src);
    return false;
}